

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

bool __thiscall SQFuncState::IsConstant(SQFuncState *this,SQObject *name,SQObject *e)

{
  SQTable *this_00;
  bool bVar1;
  SQObjectPtr local_48;
  _func_int **local_38;
  SQObjectPtr val;
  SQObject *e_local;
  SQObject *name_local;
  SQFuncState *this_local;
  
  val.super_SQObject._unVal = (SQObjectValue)e;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&local_38);
  this_00 = (this->_sharedstate->_consts).super_SQObject._unVal.pTable;
  ::SQObjectPtr::SQObjectPtr(&local_48,name);
  bVar1 = SQTable::Get(this_00,&local_48,(SQObjectPtr *)&local_38);
  ::SQObjectPtr::~SQObjectPtr(&local_48);
  if (bVar1) {
    ((val.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
    _vptr_SQRefCounted = local_38;
    ((val.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
    _uiRef = val.super_SQObject._0_8_;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  return bVar1;
}

Assistant:

bool SQFuncState::IsConstant(const SQObject &name,SQObject &e)
{
    SQObjectPtr val;
    if(_table(_sharedstate->_consts)->Get(name,val)) {
        e = val;
        return true;
    }
    return false;
}